

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseSingleValue(Parser *this,string *name,Value *e,bool check_now)

{
  size_type *psVar1;
  byte bVar2;
  ulong uVar3;
  Value *pVVar4;
  bool bVar5;
  bool bVar6;
  CheckedError CVar7;
  long lVar8;
  char *pcVar9;
  bool check;
  undefined1 check_00;
  int iVar10;
  undefined7 in_register_00000009;
  string *result;
  int iVar11;
  uint uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte in_R8B;
  BaseType req;
  int iVar13;
  bool *destmatch;
  bool match;
  bool local_142;
  allocator<char> local_141;
  ulong local_140;
  uint local_134;
  uint8_t val;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  Value *local_110;
  allocator<char> local_101;
  int16_t val_2;
  byte local_e0;
  uint local_dc;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  result = (string *)CONCAT71(in_register_00000009,check_now);
  iVar11 = *(int *)((long)&name->field_2 + 0xc);
  if ((iVar11 == 0x2d) || (iVar11 == 0x2b)) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
    CheckedError::~CheckedError((CheckedError *)this);
    if (*(int *)((long)&name->field_2 + 0xc) == 0x104) {
      std::__cxx11::string::insert((ulong)&name[1]._M_string_length,0,'\x01');
      iVar11 = *(int *)((long)&name->field_2 + 0xc);
      goto LAB_001174d1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val,"constant name expected",(allocator<char> *)&val_2);
    Error(this,name);
LAB_00117592:
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val;
  }
  else {
LAB_001174d1:
    uVar12 = *(uint *)&(result->_M_dataplus)._M_p;
    local_140 = (ulong)uVar12;
    req = (BaseType)result;
    local_e0 = in_R8B;
    if (iVar11 != 0x104) {
      bVar6 = false;
      iVar13 = (int)e;
      if (iVar11 == 0x101) {
        local_110 = e;
        if (uVar12 == 0xd) {
          TryTypedValue(this,name,iVar13,true,(Value *)0x1,req,(bool *)0xd);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        local_dc = (uint)local_140;
        goto LAB_0011764a;
      }
      if (uVar12 - 0xb < 2 && iVar11 == 0x103) {
        TryTypedValue(this,name,iVar13,true,(Value *)0x1,req,(bool *)0xb);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        iVar11 = *(int *)((long)&name->field_2 + 0xc);
      }
      if (iVar11 == 0x102) {
        local_142 = (int)local_140 - 1U < 0xc;
        check_00 = 2;
        destmatch = (bool *)0x7;
        goto LAB_00117a1f;
      }
LAB_00117a3d:
      if (((bVar6) || ((*(int *)&(result->_M_dataplus)._M_p - 0xeU & 0xfffffffb) != 0)) ||
         (*(int *)((long)&name->field_2 + 0xc) != 0x5b)) {
        if (bVar6) {
LAB_00117a4d:
          uVar12 = *(int *)&(result->_M_dataplus)._M_p - 1;
          if (((uVar12 < 0xc & local_e0) == 1) &&
             (bVar6 = std::operator!=(result + 1,"null"), bVar6)) {
            CVar7 = (CheckedError)
                    (*(code *)(&DAT_0025b088 + *(int *)(&DAT_0025b088 + (ulong)uVar12 * 4)))();
            return CVar7;
          }
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
          goto LAB_0011759c;
        }
        _val = (pointer)&local_120;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        TokenToStringId_abi_cxx11_(&local_b0,(Parser *)name,*(int *)((long)&name->field_2 + 0xc));
        std::operator+(&local_90,"Cannot assign token starting with \'",&local_b0);
        uVar3 = local_140;
        std::operator+(&local_70,&local_90,"\' to value of <");
        pcVar9 = TypeName((BaseType)uVar3);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar9,&local_141);
        std::operator+(&local_50,&local_70,&local_d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_2,
                       &local_50,"> type.");
        std::__cxx11::string::append((string *)&val);
        std::__cxx11::string::~string((string *)&val_2);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        Error(this,name);
      }
      else {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        if (*(int *)((long)&name->field_2 + 0xc) == 0x5d) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::assign((char *)(result + 1));
          goto LAB_00117a4d;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,"Expected `]` in vector default",(allocator<char> *)&val_2);
        Error(this,name);
      }
      goto LAB_00117592;
    }
    local_dc = uVar12;
    local_110 = e;
    if (*(char *)name->_M_string_length == '(') {
      ParseFunction(this,name,e);
      goto LAB_0011759c;
    }
LAB_0011764a:
    local_142 = uVar12 == 0xd;
    bVar6 = false;
    local_dc = local_dc - 1;
    if ((0xb < local_dc || iVar11 != 0x101) || (*(char *)&name[1]._M_dataplus._M_p != '\0')) {
      iVar13 = (int)local_140;
      check = SUB41(iVar11,0);
      if (iVar13 == 2) {
        psVar1 = &name[1]._M_string_length;
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar1,"true");
        if ((bVar5) ||
           (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)psVar1,"false"), bVar5)) {
          std::__cxx11::string::assign((char *)psVar1);
          iVar13 = (int)local_140;
          if (iVar11 != *(int *)((long)&name->field_2 + 0xc)) goto LAB_001177ef;
          TryTypedValue(this,name,(int)local_110,check,(Value *)0x1,req,(bool *)0x2);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        iVar13 = (int)local_140;
      }
LAB_001177ef:
      if ((0xfffffff3 < iVar13 - 0xdU) &&
         (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&name[1]._M_string_length,"null"), bVar5)) {
        std::__cxx11::string::assign((char *)(result + 1));
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        bVar6 = true;
        iVar13 = (int)local_140;
      }
      uVar12 = iVar13 - 0xb;
      if ((((bVar6) || (iVar13 == 2)) || (uVar12 < 0xfffffff6)) ||
         (((int)*(char *)name[1]._M_string_length != 0x5f &&
          (0x19 < ((int)*(char *)name[1]._M_string_length & 0xffffffdfU) - 0x41)))) {
        bVar2 = bVar6 ^ 1;
        if ((bool)(iVar11 == 0x101 & bVar2 & local_dc < 0xc)) {
          psVar1 = &name[1]._M_string_length;
          local_134 = uVar12;
          local_d8 = result;
          lVar8 = std::__cxx11::string::find_last_not_of((char)psVar1,0x20);
          if (lVar8 != -1) {
            std::__cxx11::string::resize((ulong)psVar1);
          }
          result = local_d8;
          uVar12 = local_134;
          if ((*(int *)&(local_d8->_M_dataplus)._M_p - 0xbU < 2) &&
             (lVar8 = std::__cxx11::string::rfind((char)psVar1,0x29), result = local_d8,
             uVar12 = local_134, lVar8 != -1)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val
                           ,"invalid number: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar1);
            Error(this,name);
            goto LAB_00117592;
          }
        }
      }
      else {
        local_134 = uVar12;
        ParseEnumFromString(this,(Type *)name,result);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        bVar6 = true;
        bVar2 = 0;
        uVar12 = local_134;
      }
      iVar10 = *(int *)((long)&name->field_2 + 0xc);
      req = (BaseType)result;
      if ((bool)(uVar12 < 2 & iVar11 == iVar10 & bVar2)) {
        TryTypedValue(this,name,(int)local_110,check,(Value *)0x1,req,(bool *)0xb);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        iVar10 = *(int *)((long)&name->field_2 + 0xc);
      }
      if ((bool)(local_dc < 10 & iVar11 == iVar10 & ~bVar6)) {
        TryTypedValue(this,name,(int)local_110,check,(Value *)0x1,req,(bool *)0x7);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
        iVar10 = *(int *)((long)&name->field_2 + 0xc);
      }
      iVar13 = (int)local_110;
      if ((!bVar6) && (iVar10 == 0x101)) {
        check_00 = true;
        destmatch = (bool *)0xd;
LAB_00117a1f:
        TryTypedValue(this,name,iVar13,(bool)check_00,(Value *)(ulong)local_142,req,destmatch);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011759c;
        CheckedError::~CheckedError((CheckedError *)this);
      }
      goto LAB_00117a3d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "type mismatch or invalid value, an initializer of non-string field must be trivial ASCII string: type: "
               ,&local_141);
    pcVar9 = TypeName((BaseType)local_140);
    std::operator+(&local_90,&local_b0,pcVar9);
    pVVar4 = local_110;
    std::operator+(&local_70,&local_90,", name: ");
    if (pVVar4 == (Value *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_101);
    }
    else {
      std::__cxx11::string::string((string *)&local_d0,(string *)pVVar4);
    }
    std::operator+(&local_50,&local_70,&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_2,
                   &local_50,", value: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &name[1]._M_string_length);
    Error(this,name);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&val_2);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_b0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0011759c:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseSingleValue(const std::string *name, Value &e,
                                      bool check_now) {
  if (token_ == '+' || token_ == '-') {
    const char sign = static_cast<char>(token_);
    // Get an indentifier: NAN, INF, or function name like cos/sin/deg.
    NEXT();
    if (token_ != kTokenIdentifier) return Error("constant name expected");
    attribute_.insert(size_t(0), size_t(1), sign);
  }

  const auto in_type = e.type.base_type;
  const auto is_tok_ident = (token_ == kTokenIdentifier);
  const auto is_tok_string = (token_ == kTokenStringConstant);

  // First see if this could be a conversion function.
  if (is_tok_ident && *cursor_ == '(') { return ParseFunction(name, e); }

  // clang-format off
  auto match = false;

  #define IF_ECHECK_(force, dtoken, check, req)    \
    if (!match && ((dtoken) == token_) && ((check) || flatbuffers::IsConstTrue(force))) \
      ECHECK(TryTypedValue(name, dtoken, check, e, req, &match))
  #define TRY_ECHECK(dtoken, check, req) IF_ECHECK_(false, dtoken, check, req)
  #define FORCE_ECHECK(dtoken, check, req) IF_ECHECK_(true, dtoken, check, req)
  // clang-format on

  if (is_tok_ident || is_tok_string) {
    const auto kTokenStringOrIdent = token_;
    // The string type is a most probable type, check it first.
    TRY_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
               BASE_TYPE_STRING);

    // avoid escaped and non-ascii in the string
    if (!match && is_tok_string && IsScalar(in_type) &&
        !attr_is_trivial_ascii_string_) {
      return Error(
          std::string("type mismatch or invalid value, an initializer of "
                      "non-string field must be trivial ASCII string: type: ") +
          TypeName(in_type) + ", name: " + (name ? *name : "") +
          ", value: " + attribute_);
    }

    // A boolean as true/false. Boolean as Integer check below.
    if (!match && IsBool(in_type)) {
      auto is_true = attribute_ == "true";
      if (is_true || attribute_ == "false") {
        attribute_ = is_true ? "1" : "0";
        // accepts both kTokenStringConstant and kTokenIdentifier
        TRY_ECHECK(kTokenStringOrIdent, IsBool(in_type), BASE_TYPE_BOOL);
      }
    }
    // Check for optional scalars.
    if (!match && IsScalar(in_type) && attribute_ == "null") {
      e.constant = "null";
      NEXT();
      match = true;
    }
    // Check if this could be a string/identifier enum value.
    // Enum can have only true integer base type.
    if (!match && IsInteger(in_type) && !IsBool(in_type) &&
        IsIdentifierStart(*attribute_.c_str())) {
      ECHECK(ParseEnumFromString(e.type, &e.constant));
      NEXT();
      match = true;
    }
    // Parse a float/integer number from the string.
    // A "scalar-in-string" value needs extra checks.
    if (!match && is_tok_string && IsScalar(in_type)) {
      // Strip trailing whitespaces from attribute_.
      auto last_non_ws = attribute_.find_last_not_of(' ');
      if (std::string::npos != last_non_ws) attribute_.resize(last_non_ws + 1);
      if (IsFloat(e.type.base_type)) {
        // The functions strtod() and strtof() accept both 'nan' and
        // 'nan(number)' literals. While 'nan(number)' is rejected by the parser
        // as an unsupported function if is_tok_ident is true.
        if (attribute_.find_last_of(')') != std::string::npos) {
          return Error("invalid number: " + attribute_);
        }
      }
    }
    // Float numbers or nan, inf, pi, etc.
    TRY_ECHECK(kTokenStringOrIdent, IsFloat(in_type), BASE_TYPE_FLOAT);
    // An integer constant in string.
    TRY_ECHECK(kTokenStringOrIdent, IsInteger(in_type), BASE_TYPE_INT);
    // Unknown tokens will be interpreted as string type.
    // An attribute value may be a scalar or string constant.
    FORCE_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
                 BASE_TYPE_STRING);
  } else {
    // Try a float number.
    TRY_ECHECK(kTokenFloatConstant, IsFloat(in_type), BASE_TYPE_FLOAT);
    // Integer token can init any scalar (integer of float).
    FORCE_ECHECK(kTokenIntegerConstant, IsScalar(in_type), BASE_TYPE_INT);
  }
  // Match empty vectors for default-empty-vectors.
  if (!match && IsVector(e.type) && token_ == '[') {
    NEXT();
    if (token_ != ']') { return Error("Expected `]` in vector default"); }
    NEXT();
    match = true;
    e.constant = "[]";
  }

#undef FORCE_ECHECK
#undef TRY_ECHECK
#undef IF_ECHECK_

  if (!match) {
    std::string msg;
    msg += "Cannot assign token starting with '" + TokenToStringId(token_) +
           "' to value of <" + std::string(TypeName(in_type)) + "> type.";
    return Error(msg);
  }
  const auto match_type = e.type.base_type;  // may differ from in_type
  // The check_now flag must be true when parse a fbs-schema.
  // This flag forces to check default scalar values or metadata of field.
  // For JSON parser the flag should be false.
  // If it is set for JSON each value will be checked twice (see ParseTable).
  // Special case 'null' since atot can't handle that.
  if (check_now && IsScalar(match_type) && e.constant != "null") {
    // clang-format off
    switch (match_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
      case BASE_TYPE_ ## ENUM: {\
          CTYPE val; \
          ECHECK(atot(e.constant.c_str(), *this, &val)); \
          SingleValueRepack(e, val); \
        break; }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
  }
  return NoError();
}